

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O2

QRect __thiscall
QFusionStyle::subControlRect
          (QFusionStyle *this,ComplexControl control,QStyleOptionComplex *option,
          SubControl subControl,QWidget *widget)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  Orientation OVar4;
  TickPosition TVar5;
  undefined4 uVar6;
  undefined1 auVar7 [12];
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  QStyleOptionSpinBox *pQVar13;
  QStyleOptionSlider *this_00;
  QPoint QVar14;
  QStyleOptionTitleBar *pQVar15;
  QStyleOptionGroupBox *pQVar16;
  QStyleOptionComboBox *pQVar17;
  QStyle *pQVar18;
  QStyle *pQVar19;
  undefined1 auVar20 [8];
  Representation RVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  QRect *pQVar26;
  uint uVar27;
  LayoutDirection direction;
  Representation RVar28;
  Representation RVar29;
  Representation RVar30;
  Representation RVar31;
  int iVar32;
  ulong uVar33;
  long in_FS_OFFSET;
  qreal qVar34;
  qreal qVar35;
  QRect QVar36;
  undefined1 auVar37 [16];
  QRect QVar38;
  undefined8 local_88;
  TickPosition local_68;
  undefined1 local_48 [8];
  Representation RStack_40;
  Representation RStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar36 = QCommonStyle::subControlRect(&this->super_QCommonStyle,control,option,subControl,widget);
  _local_48 = QVar36;
  if (CC_GroupBox < control) goto switchD_00397f48_caseD_2;
  uVar33 = QVar36._0_8_ >> 0x20;
  switch(control) {
  case CC_SpinBox:
    pQVar13 = qstyleoption_cast<QStyleOptionSpinBox_const*>(&option->super_QStyleOption);
    if (pQVar13 == (QStyleOptionSpinBox *)0x0) break;
    pQVar26 = &(pQVar13->super_QStyleOptionComplex).super_QStyleOption.rect;
    RVar31.m_i = (((pQVar13->super_QStyleOptionComplex).super_QStyleOption.rect.y2.m_i -
                  (pQVar13->super_QStyleOptionComplex).super_QStyleOption.rect.y1.m_i) + 1) / 2;
    bVar3 = pQVar13->frame;
    uVar23 = 0xfffffffa;
    if (bVar3 == false) {
      uVar23 = (uint)bVar3;
    }
    qVar35 = QStyleHelper::dpiScaled(14.0,&option->super_QStyleOption);
    if (subControl - SC_ComboBoxFrame < 8) {
      iVar25 = (int)qVar35;
      iVar9 = (uint)(bVar3 ^ 1U) + (uint)(bVar3 ^ 1U) * 2 + -3;
      iVar24 = (pQVar13->super_QStyleOptionComplex).super_QStyleOption.rect.x2.m_i -
               (pQVar13->super_QStyleOptionComplex).super_QStyleOption.rect.x1.m_i;
      RVar29.m_i = (uint)bVar3 + (uint)bVar3 * 2;
      iVar32 = (iVar9 - iVar25) + iVar24 + 1;
      RVar21.m_i = (iVar9 - iVar25) + iVar24 + 3;
      switch(subControl) {
      case SC_ComboBoxFrame:
        if (pQVar13->buttonSymbols == NoButtons) {
LAB_00398652:
          QVar36 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
          uVar33 = 0;
          goto LAB_003988eb;
        }
        local_48._4_4_ = RVar29.m_i;
        local_48._0_4_ = RVar21.m_i;
        RStack_40.m_i = iVar25 + iVar32 + 1;
        RStack_3c.m_i = RVar31.m_i + -1;
        break;
      case SC_ComboBoxEditField:
        if (pQVar13->buttonSymbols == NoButtons) goto LAB_00398652;
        local_48._4_4_ = RVar31.m_i;
        local_48._0_4_ = RVar21.m_i;
        RStack_40.m_i = iVar25 + iVar32 + 1;
        RStack_3c.m_i = iVar9 + (pQVar13->super_QStyleOptionComplex).super_QStyleOption.rect.y2.m_i;
        break;
      case SC_ComboBoxArrow:
        _local_48 = *pQVar26;
        break;
      case SC_ComboBoxListBoxPopup:
        if (pQVar13->buttonSymbols == NoButtons) {
          local_48._4_4_ = RVar29.m_i;
          local_48._0_4_ = RVar29.m_i;
          RStack_40.m_i = RVar29.m_i + uVar23 + iVar24;
          RStack_3c.m_i =
               (RVar29.m_i + uVar23 +
               (pQVar13->super_QStyleOptionComplex).super_QStyleOption.rect.y2.m_i) -
               (pQVar13->super_QStyleOptionComplex).super_QStyleOption.rect.y1.m_i;
        }
        else {
          iVar24 = 0;
          if (0 < RVar29.m_i + -1) {
            iVar24 = RVar29.m_i + -1;
          }
          local_48._4_4_ = RVar29.m_i;
          local_48._0_4_ = RVar29.m_i;
          RStack_40.m_i = ((iVar9 + RVar29.m_i + -1) - iVar24) + RVar21.m_i;
          RStack_3c.m_i =
               ((pQVar13->super_QStyleOptionComplex).super_QStyleOption.rect.y2.m_i - RVar29.m_i) -
               (pQVar13->super_QStyleOptionComplex).super_QStyleOption.rect.y1.m_i;
        }
      }
    }
    direction = (pQVar13->super_QStyleOptionComplex).super_QStyleOption.direction;
    goto LAB_003988cb;
  case CC_ComboBox:
    if (subControl == SC_ComboBoxEditField) {
      pQVar26 = &(option->super_QStyleOption).rect;
      _local_48 = QStyle::visualRect((option->super_QStyleOption).direction,pQVar26,
                                     (QRect *)local_48);
      iVar9 = (option->super_QStyleOption).rect.x2.m_i;
      uVar1 = (option->super_QStyleOption).rect.x1;
      uVar2 = (option->super_QStyleOption).rect.y1;
      qVar35 = QStyleHelper::dpiScaled(19.0,&option->super_QStyleOption);
      RStack_40.m_i = (iVar9 - (int)qVar35) + -2;
      local_48._0_4_ = uVar1 + 2;
      local_48._4_4_ = uVar2 + 2;
      RStack_3c.m_i =
           ((uVar2 + (option->super_QStyleOption).rect.y2.m_i) -
           (option->super_QStyleOption).rect.y1.m_i) + -2;
      pQVar17 = qstyleoption_cast<QStyleOptionComboBox_const*>(&option->super_QStyleOption);
      QVar36 = _local_48;
      if ((pQVar17 != (QStyleOptionComboBox *)0x0) && (pQVar17->editable == false)) {
        uVar8 = local_48._0_4_;
        local_48._0_4_ = local_48._0_4_ + 2;
        if (((pQVar17->super_QStyleOptionComplex).super_QStyleOption.state.
             super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.
             i & 0x24) != 0) {
          local_48._4_4_ = QVar36.y1.m_i;
          local_48._4_4_ = local_48._4_4_ + 1;
          local_48._0_4_ = uVar8 + 3;
          RStack_40.m_i = QVar36.x2.m_i.m_i + 1;
          RStack_3c.m_i = QVar36.y2.m_i.m_i + 1;
        }
      }
      direction = (option->super_QStyleOption).direction;
      goto LAB_003988cb;
    }
    if (subControl == SC_ComboBoxArrow) {
      qVar35 = QStyleHelper::dpi(&option->super_QStyleOption);
      pQVar26 = &(option->super_QStyleOption).rect;
      QVar36 = QStyle::visualRect((option->super_QStyleOption).direction,pQVar26,(QRect *)local_48);
      _local_48 = QVar36;
      qVar34 = QStyleHelper::dpiScaled(18.0,qVar35);
      RVar29.m_i = QVar36.x2.m_i.m_i - (int)qVar34;
      uVar8 = local_48._4_4_;
      RVar31.m_i = local_48._4_4_ + -2;
      qVar35 = QStyleHelper::dpiScaled(19.0,qVar35);
      iVar9 = (uVar8 + RStack_3c.m_i) - local_48._4_4_;
      local_48._4_4_ = RVar31.m_i;
      local_48._0_4_ = RVar29.m_i;
      RStack_40.m_i = (int)qVar35 + RVar29.m_i + -1;
      RStack_3c.m_i = iVar9 + 2;
      _local_48 = QStyle::visualRect((option->super_QStyleOption).direction,pQVar26,
                                     (QRect *)local_48);
    }
    break;
  case CC_Slider:
    this_00 = qstyleoption_cast<QStyleOptionSlider_const*>(&option->super_QStyleOption);
    if (this_00 != (QStyleOptionSlider *)0x0) {
      pQVar18 = QStyle::proxy((QStyle *)this_00);
      uVar23 = (**(code **)(*(long *)pQVar18 + 0xe0))(pQVar18,0xe,option,widget);
      RVar29 = QVar36.y1.m_i;
      RVar31 = QVar36.x1.m_i;
      if (subControl == SC_ComboBoxFrame) {
        QVar14 = QRect::center(&(this_00->super_QStyleOptionComplex).super_QStyleOption.rect);
        RVar30 = QVar14.yp.m_i;
        qVar35 = QStyleHelper::dpiScaled(7.0,&option->super_QStyleOption);
        TVar5 = this_00->tickPosition;
        RVar28 = QVar14.xp.m_i;
        if (this_00->orientation == Horizontal) {
          RVar21.m_i = (int)qVar35 + -1 + RVar29.m_i;
          if (((TVar5 & TicksBothSides) != TicksBothSides) &&
             (RVar30.m_i = RVar30.m_i + (-(TVar5 & TicksAbove) & uVar23),
             (TVar5 & TicksBelow) != NoTicks)) {
            RVar30.m_i = (RVar30.m_i - uVar23) + 1;
          }
        }
        else {
          RStack_40.m_i = (int)qVar35 + -1 + RVar31.m_i;
          RVar21 = QVar36.y2.m_i;
          if (((TVar5 & TicksBothSides) != TicksBothSides) &&
             (RVar28.m_i = RVar28.m_i + (-(TVar5 & TicksAbove) & uVar23),
             (TVar5 & TicksBelow) != NoTicks)) {
            RVar28.m_i = (RVar28.m_i - uVar23) + 1;
          }
        }
        local_48._0_4_ = (RStack_40.m_i - RVar31.m_i) / -2 + RVar28.m_i;
        local_48._4_4_ = (RVar21.m_i - RVar29.m_i) / -2 + RVar30.m_i;
        RStack_40.m_i = local_48._0_4_ + (RStack_40.m_i - RVar31.m_i);
        RStack_3c.m_i = local_48._4_4_ + (RVar21.m_i - RVar29.m_i);
      }
      else if (subControl == SC_ComboBoxEditField) {
        OVar4 = this_00->orientation;
        local_68 = this_00->tickPosition & TicksBothSides;
        pQVar18 = QStyle::proxy((QStyle *)(ulong)(this_00->tickPosition & TicksBothSides));
        iVar9 = (**(code **)(*(long *)pQVar18 + 0xe0))(pQVar18,0xb,option,widget);
        uVar11 = iVar9 - 1;
        pQVar26 = &(this_00->super_QStyleOptionComplex).super_QStyleOption.rect;
        if (OVar4 == Horizontal) {
          RStack_3c.m_i = RVar29.m_i + uVar11;
          pQVar18 = QStyle::proxy((QStyle *)(ulong)uVar11);
          iVar24 = (**(code **)(*(long *)pQVar18 + 0xe0))(pQVar18,0xd,option,widget);
          RStack_40.m_i = iVar24 + RVar31.m_i + -1;
          QVar14 = QRect::center(pQVar26);
          QVar36 = _local_48;
          RVar31.m_i = iVar9 / -2 + QVar14.yp.m_i.m_i;
          if ((local_68 != TicksBothSides) &&
             (RVar31.m_i = RVar31.m_i + (-(this_00->tickPosition & TicksAbove) & uVar23),
             (this_00->tickPosition & TicksBelow) != NoTicks)) {
            RVar31.m_i = (RVar31.m_i - uVar23) + 1;
          }
          RStack_3c.m_i = uVar11 + RVar31.m_i;
          local_48._0_4_ = QVar36.x1.m_i;
          local_48._4_4_ = RVar31.m_i;
        }
        else {
          RStack_40.m_i = uVar11 + RVar31.m_i;
          pQVar18 = QStyle::proxy((QStyle *)(ulong)(uVar11 + RVar31.m_i));
          iVar24 = (**(code **)(*(long *)pQVar18 + 0xe0))(pQVar18,0xd,option,widget);
          RStack_3c.m_i = iVar24 + RVar29.m_i + -1;
          QVar14 = QRect::center(pQVar26);
          RVar31.m_i = iVar9 / -2 + QVar14.xp.m_i.m_i;
          if ((local_68 != TicksBothSides) &&
             (RVar31.m_i = RVar31.m_i + (-(this_00->tickPosition & TicksAbove) & uVar23),
             (this_00->tickPosition & TicksBelow) != NoTicks)) {
            RVar31.m_i = (RVar31.m_i - uVar23) + 1;
          }
          RStack_40.m_i = uVar11 + RVar31.m_i;
          local_48._0_4_ = RVar31.m_i;
        }
      }
    }
    break;
  case CC_TitleBar:
    pQVar15 = qstyleoption_cast<QStyleOptionTitleBar_const*>(&option->super_QStyleOption);
    if (pQVar15 == (QStyleOptionTitleBar *)0x0) break;
    pQVar26 = &(pQVar15->super_QStyleOptionComplex).super_QStyleOption.rect;
    iVar24 = (pQVar15->super_QStyleOptionComplex).super_QStyleOption.rect.y1.m_i;
    iVar25 = (pQVar15->super_QStyleOptionComplex).super_QStyleOption.rect.y2.m_i - iVar24;
    iVar9 = iVar25 + 1;
    uVar27 = iVar25 - 3;
    uVar23 = pQVar15->titleBarState;
    uVar22 = 0;
    uVar11 = 0;
    switch(subControl) {
    case SC_ComboBoxFrame:
      if (((pQVar15->titleBarFlags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 0x2000) == 0) break;
      iVar32 = (pQVar26->x1).m_i;
      local_48._4_4_ = iVar24 + 3;
      local_48._0_4_ = iVar32 + 5;
      RStack_40.m_i = iVar9 + iVar32 + -2;
      goto LAB_003988b5;
    case SC_ComboBoxEditField:
switchD_00398439_caseD_2:
      if (((uVar23 & 1) == 0) &&
         (((pQVar15->titleBarFlags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 0x4000) != 0)) {
        uVar11 = uVar11 + uVar27;
LAB_00398829:
        if (((uVar23 & 2) == 0) ||
           (((pQVar15->titleBarFlags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i & 0x8000) == 0)) {
          if (subControl != SC_ScrollBarFirst) goto switchD_00398439_caseD_4;
          break;
        }
        uVar11 = uVar11 + uVar27;
        goto LAB_00398853;
      }
      if (subControl != SC_ComboBoxEditField) goto LAB_003987bd;
      break;
    case SC_ComboBoxEditField|SC_ComboBoxFrame:
    case SC_ComboBoxArrow|SC_ComboBoxFrame:
    case SC_ComboBoxArrow|SC_ComboBoxEditField:
    case SC_ComboBoxArrow|SC_ComboBoxEditField|SC_ComboBoxFrame:
      break;
    case SC_ComboBoxArrow:
switchD_00398439_caseD_4:
      if (((uVar23 & 2) == 0) &&
         (((pQVar15->titleBarFlags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 0x8000) != 0)) {
        uVar11 = uVar11 + uVar27;
      }
      else {
LAB_00398853:
        if (subControl == SC_ComboBoxArrow) break;
      }
LAB_00398859:
      if (((uVar23 & 1) == 0) &&
         (((pQVar15->titleBarFlags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 0x20000) != 0)) {
        uVar11 = uVar11 + uVar27;
        goto LAB_0039887f;
      }
      if (subControl != SC_ScrollBarLast) goto LAB_0039886b;
      break;
    case SC_ComboBoxListBoxPopup:
      goto switchD_00398439_caseD_8;
    default:
      uVar11 = uVar22;
      if (subControl == SC_ScrollBarFirst) {
LAB_003987bd:
        if (((uVar23 & 1) == 0) ||
           (((pQVar15->titleBarFlags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i & 0x4000) == 0)) goto LAB_00398829;
        uVar11 = uVar11 + uVar27;
        goto switchD_00398439_caseD_4;
      }
      if (subControl == SC_ScrollBarLast) goto LAB_00398859;
      if (subControl != SC_ScrollBarSlider) {
        if (subControl == SC_ScrollBarGroove) {
          uVar11 = (int)((pQVar15->titleBarFlags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                         super_QFlagsStorage<Qt::WindowType>.i << 0xf) >> 0x1f & uVar27;
          goto switchD_00398439_caseD_2;
        }
        if (subControl == SC_TitleBarLabel) {
          uVar23 = (pQVar15->titleBarFlags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                   super_QFlagsStorage<Qt::WindowType>.i;
          if ((uVar23 & 0x3000) != 0) {
            uVar6 = pQVar26->x1;
            QVar36 = *pQVar26;
            _local_48 = QVar36;
            if ((uVar23 >> 0xd & 1) != 0) {
              stack0xffffffffffffffbc = QVar36._4_12_;
              local_48._0_4_ = uVar6 + uVar27;
              QVar38 = _local_48;
              RStack_40 = QVar36.x2.m_i;
              RStack_3c = QVar36.y2.m_i;
              local_48 = QVar38._0_8_;
              RStack_40.m_i = (RStack_40.m_i - iVar9) + 4;
            }
            if ((uVar23 >> 0xe & 1) != 0) {
              RStack_40.m_i = (RStack_40.m_i - iVar9) + 4;
            }
            if ((short)uVar23 < 0) {
              RStack_40.m_i = (RStack_40.m_i - iVar9) + 4;
            }
            if ((uVar23 >> 0x11 & 1) != 0) {
              RStack_40.m_i = (RStack_40.m_i - iVar9) + 4;
            }
            if ((uVar23 >> 0x10 & 1) != 0) {
              RStack_40.m_i = (RStack_40.m_i - iVar9) + 4;
            }
          }
        }
        break;
      }
LAB_0039886b:
      if (((uVar23 & 1) == 0) ||
         (((pQVar15->titleBarFlags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 0x20000) == 0)) {
LAB_0039887f:
        if (subControl == SC_ScrollBarSlider) break;
      }
      else {
        uVar11 = uVar11 + uVar27;
      }
switchD_00398439_caseD_8:
      if (((pQVar15->titleBarFlags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 0x2000) == 0) {
        if (subControl == SC_ComboBoxListBoxPopup) break;
      }
      else {
        uVar11 = uVar11 + uVar27;
      }
      iVar32 = (pQVar15->super_QStyleOptionComplex).super_QStyleOption.rect.x2.m_i - uVar11;
      local_48._4_4_ = iVar24 + 3;
      local_48._0_4_ = iVar32 + -3;
      RStack_40.m_i = iVar9 + iVar32 + -10;
LAB_003988b5:
      local_48._0_4_ = local_48._0_4_;
      local_48._4_4_ = local_48._4_4_;
      RStack_3c.m_i = iVar24 + iVar25 + -3;
    }
    direction = (pQVar15->super_QStyleOptionComplex).super_QStyleOption.direction;
LAB_003988cb:
    _local_48 = QStyle::visualRect(direction,pQVar26,(QRect *)local_48);
    break;
  case CC_GroupBox:
    pQVar16 = qstyleoption_cast<QStyleOptionGroupBox_const*>(&option->super_QStyleOption);
    if (pQVar16 == (QStyleOptionGroupBox *)0x0) goto LAB_003988eb;
    uVar23 = (pQVar16->textAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i;
    if ((pQVar16->text).d.size == 0) {
      iVar9 = 0;
    }
    else {
      iVar9 = QFontMetrics::height();
    }
    if (subControl == SC_ComboBoxListBoxPopup) goto LAB_003988eb;
    if (subControl == SC_ComboBoxArrow) {
      iVar24 = (option->super_QStyleOption).rect.x1.m_i;
      iVar25 = (option->super_QStyleOption).rect.y1.m_i;
      iVar32 = (option->super_QStyleOption).rect.x2.m_i;
      iVar12 = (option->super_QStyleOption).rect.y2.m_i;
      iVar10 = 0;
      if (((option->subControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
           super_QFlagsStorage<QStyle::SubControl>.i & 1) != 0) {
        iVar10 = (**(code **)(*(long *)&(this->super_QCommonStyle).super_QStyle + 0xe0))
                           (this,0x26,option,widget);
      }
      if (iVar9 < iVar10) {
        iVar9 = iVar10;
      }
      QVar36.y1.m_i = 0;
      QVar36.x1.m_i = iVar24 + 3;
      uVar33 = (ulong)(iVar25 + iVar9 + 6);
      QVar36.y2.m_i = iVar12 + -3;
      QVar36.x2.m_i = iVar32 + -3;
      goto LAB_003988eb;
    }
    auVar37 = QFontMetrics::boundingRect((QString *)&(option->super_QStyleOption).fontMetrics);
    iVar32 = auVar37._8_4_ - auVar37._0_4_;
    pQVar18 = QStyle::proxy((QStyle *)(auVar37._0_8_ >> 0x20));
    pQVar18 = (QStyle *)(**(code **)(*(long *)pQVar18 + 0xe0))(pQVar18,0x25,option,widget);
    pQVar19 = QStyle::proxy(pQVar18);
    iVar9 = (**(code **)(*(long *)pQVar19 + 0xe0))(pQVar19,0x26,option,widget);
    uVar27 = (int)pQVar18 + 5;
    iVar25 = iVar32 + (-((option->subControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
                         super_QFlagsStorage<QStyle::SubControl>.i & 1) & uVar27) + 3;
    _local_48 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
    iVar24 = ((option->super_QStyleOption).rect.x2.m_i - (option->super_QStyleOption).rect.x1.m_i) +
             1;
    uVar11 = iVar24 - iVar25;
    if (uVar11 != 0 && iVar25 <= iVar24) {
      uVar22 = uVar23 & 0x1e0;
      uVar23 = uVar23 & 0x1f;
      if (uVar23 == 1) {
        if (uVar22 == 0x80) {
          pQVar19 = QStyle::proxy((QStyle *)(ulong)uVar11);
          RVar31.m_i = (**(code **)(*(long *)pQVar19 + 0xe0))(pQVar19,0x4b,option,widget);
          iVar24 = RVar31.m_i - local_48._0_4_;
          RStack_40.m_i = RStack_40.m_i + iVar24;
          local_48._0_4_ = RVar31.m_i;
        }
      }
      else if (uVar23 == 2) {
        iVar12 = 0;
        if (uVar22 == 0x80) {
          pQVar19 = QStyle::proxy((QStyle *)0x0);
          iVar12 = (**(code **)(*(long *)pQVar19 + 0xe0))(pQVar19,0x4d,pQVar16,widget);
        }
        RVar31.m_i = iVar24 - (iVar25 + iVar12);
        iVar24 = RVar31.m_i - local_48._0_4_;
        RStack_40.m_i = RStack_40.m_i + iVar24;
        local_48._0_4_ = RVar31.m_i;
      }
      else if (uVar23 == 4) {
        auVar7._4_8_ = 0;
        auVar7._0_4_ = (int)uVar11 / 2 - 1;
        _local_48 = auVar7 << 0x40;
        RStack_3c.m_i = -1;
        local_48._0_4_ = (int)uVar11 / 2;
      }
    }
    RVar31.m_i = (auVar37._12_4_ - auVar37._4_4_) + 3;
    uVar8 = local_48._0_4_;
    if (subControl == SC_ComboBoxEditField) {
      iVar9 = iVar32 + local_48._0_4_ + 2;
      RStack_40.m_i = iVar9;
      RStack_3c.m_i = RVar31.m_i;
      local_48._4_4_ = 1;
      local_48 = (undefined1  [8])CONCAT44(local_48._4_4_,uVar8);
      if (((option->subControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
           super_QFlagsStorage<QStyle::SubControl>.i & 1) != 0) {
        local_48._0_4_ = uVar8 + uVar27;
        RStack_40.m_i = iVar9 + uVar27;
      }
    }
    else if (subControl == SC_ComboBoxFrame) {
      local_48._4_4_ = 0;
      if (RVar31.m_i - iVar9 != 0 && iVar9 <= RVar31.m_i) {
        local_48._4_4_ = (RVar31.m_i - iVar9) / 2;
      }
      local_48._0_4_ = local_48._0_4_ + 1;
      RStack_40.m_i = (int)pQVar18 + uVar8;
      RStack_3c.m_i = iVar9 + -1 + local_48._4_4_;
    }
    QVar36 = QStyle::visualRect((option->super_QStyleOption).direction,
                                &(option->super_QStyleOption).rect,(QRect *)local_48);
    auVar20 = QVar36._0_8_;
    goto LAB_003988e7;
  }
switchD_00397f48_caseD_2:
  auVar20 = local_48;
  QVar36 = _local_48;
LAB_003988e7:
  uVar33 = (ulong)auVar20 >> 0x20;
LAB_003988eb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  QVar38._0_8_ = QVar36._0_8_ & 0xffffffff | uVar33 << 0x20;
  QVar38.x2.m_i = (int)QVar36._8_8_;
  QVar38.y2.m_i = (int)((ulong)QVar36._8_8_ >> 0x20);
  return QVar38;
}

Assistant:

QRect QFusionStyle::subControlRect(ComplexControl control, const QStyleOptionComplex *option,
                                   SubControl subControl, const QWidget *widget) const
{
    QRect rect = QCommonStyle::subControlRect(control, option, subControl, widget);

    switch (control) {
#if QT_CONFIG(slider)
    case CC_Slider:
        if (const QStyleOptionSlider *slider = qstyleoption_cast<const QStyleOptionSlider *>(option)) {
            int tickSize = proxy()->pixelMetric(PM_SliderTickmarkOffset, option, widget);
            switch (subControl) {
            case SC_SliderHandle: {
                const bool bothTicks = (slider->tickPosition & QSlider::TicksBothSides) == QSlider::TicksBothSides;
                if (slider->orientation == Qt::Horizontal) {
                    rect.setHeight(proxy()->pixelMetric(PM_SliderThickness, option, widget));
                    rect.setWidth(proxy()->pixelMetric(PM_SliderLength, option, widget));
                    int centerY = slider->rect.center().y() - rect.height() / 2;
                    if (!bothTicks) {
                        if (slider->tickPosition & QSlider::TicksAbove)
                            centerY += tickSize;
                        if (slider->tickPosition & QSlider::TicksBelow)
                            centerY -= tickSize - 1;
                    }
                    rect.moveTop(centerY);
                } else {
                    rect.setWidth(proxy()->pixelMetric(PM_SliderThickness, option, widget));
                    rect.setHeight(proxy()->pixelMetric(PM_SliderLength, option, widget));
                    int centerX = slider->rect.center().x() - rect.width() / 2;
                    if (!bothTicks) {
                        if (slider->tickPosition & QSlider::TicksAbove)
                            centerX += tickSize;
                        if (slider->tickPosition & QSlider::TicksBelow)
                            centerX -= tickSize - 1;
                    }
                    rect.moveLeft(centerX);
                }
            }
                break;
            case SC_SliderGroove: {
                QPoint grooveCenter = slider->rect.center();
                const int grooveThickness = QStyleHelper::dpiScaled(7, option);
                const bool bothTicks = (slider->tickPosition & QSlider::TicksBothSides) == QSlider::TicksBothSides;
                if (slider->orientation == Qt::Horizontal) {
                    rect.setHeight(grooveThickness);
                    if (!bothTicks) {
                        if (slider->tickPosition & QSlider::TicksAbove)
                            grooveCenter.ry() += tickSize;
                        if (slider->tickPosition & QSlider::TicksBelow)
                            grooveCenter.ry() -= tickSize - 1;
                    }
                } else {
                    rect.setWidth(grooveThickness);
                    if (!bothTicks) {
                        if (slider->tickPosition & QSlider::TicksAbove)
                            grooveCenter.rx() += tickSize;
                        if (slider->tickPosition & QSlider::TicksBelow)
                            grooveCenter.rx() -= tickSize - 1;
                    }
                }
                rect.moveCenter(grooveCenter);
                break;
            }
            default:
                break;
            }
        }
        break;
#endif // QT_CONFIG(slider)
#if QT_CONFIG(spinbox)
    case CC_SpinBox:
        if (const QStyleOptionSpinBox *spinbox = qstyleoption_cast<const QStyleOptionSpinBox *>(option)) {
            int center = spinbox->rect.height() / 2;
            int fw = spinbox->frame ? 3 : 0; // Is drawn with 3 pixels width in drawComplexControl, independently from PM_SpinBoxFrameWidth
            int y = fw;
            const int buttonWidth = QStyleHelper::dpiScaled(14, option);
            int x, lx, rx;
            x = spinbox->rect.width() - y - buttonWidth + 2;
            lx = fw;
            rx = x - fw;
            switch (subControl) {
            case SC_SpinBoxUp:
                if (spinbox->buttonSymbols == QAbstractSpinBox::NoButtons)
                    return QRect();
                rect = QRect(x, fw, buttonWidth, center - fw);
                break;
            case SC_SpinBoxDown:
                if (spinbox->buttonSymbols == QAbstractSpinBox::NoButtons)
                    return QRect();

                rect = QRect(x, center, buttonWidth, spinbox->rect.bottom() - center - fw + 1);
                break;
            case SC_SpinBoxEditField:
                if (spinbox->buttonSymbols == QAbstractSpinBox::NoButtons) {
                    rect = QRect(lx, fw, spinbox->rect.width() - 2*fw, spinbox->rect.height() - 2*fw);
                } else {
                    rect = QRect(lx, fw, rx - qMax(fw - 1, 0), spinbox->rect.height() - 2*fw);
                }
                break;
            case SC_SpinBoxFrame:
                rect = spinbox->rect;
                break;
            default:
                break;
            }
            rect = visualRect(spinbox->direction, spinbox->rect, rect);
        }
        break;
#endif // QT_CONFIG(spinbox)
    case CC_GroupBox:
        if (const QStyleOptionGroupBox *groupBox = qstyleoption_cast<const QStyleOptionGroupBox *>(option)) {
            const int groupBoxTextAlignment = groupBox->textAlignment;
            const bool hasVerticalAlignment = (groupBoxTextAlignment & Qt::AlignVertical_Mask) == Qt::AlignVCenter;
            const int fontMetricsHeight = groupBox->text.isEmpty() ? 0 : groupBox->fontMetrics.height();

            if (subControl == SC_GroupBoxFrame)
                return rect;
            else if (subControl == SC_GroupBoxContents) {
                QRect frameRect = option->rect.adjusted(0, 0, 0, -groupBoxBottomMargin);
                int margin = 3;
                int leftMarginExtension = 0;
                const int indicatorHeight = option->subControls.testFlag(SC_GroupBoxCheckBox) ?
                                                        pixelMetric(PM_IndicatorHeight, option, widget) : 0;
                const int topMargin = qMax(indicatorHeight, fontMetricsHeight) +
                                        groupBoxTopMargin;
                return frameRect.adjusted(leftMarginExtension + margin, margin + topMargin, -margin, -margin - groupBoxBottomMargin);
            }

            QSize textSize = option->fontMetrics.boundingRect(groupBox->text).size() + QSize(2, 2);
            int indicatorWidth = proxy()->pixelMetric(PM_IndicatorWidth, option, widget);
            int indicatorHeight = proxy()->pixelMetric(PM_IndicatorHeight, option, widget);

            const int width = textSize.width()
                + (option->subControls & QStyle::SC_GroupBoxCheckBox ? indicatorWidth + 5 : 0);

            rect = QRect();

            if (option->rect.width() > width) {
                switch (groupBoxTextAlignment & Qt::AlignHorizontal_Mask) {
                case Qt::AlignHCenter:
                    rect.moveLeft((option->rect.width() - width) / 2);
                    break;
                case Qt::AlignRight:
                    rect.moveLeft(option->rect.width() - width
                                  - (hasVerticalAlignment ? proxy()->pixelMetric(PM_LayoutRightMargin, groupBox, widget) : 0));
                    break;
                case Qt::AlignLeft:
                    if (hasVerticalAlignment)
                        rect.moveLeft(proxy()->pixelMetric(PM_LayoutLeftMargin, option, widget));
                    break;
                }
            }

            if (subControl == SC_GroupBoxCheckBox) {
                rect.setWidth(indicatorWidth);
                rect.setHeight(indicatorHeight);
                rect.moveTop(textSize.height() > indicatorHeight ? (textSize.height() - indicatorHeight) / 2 : 0);
                rect.translate(1, 0);
            } else if (subControl == SC_GroupBoxLabel) {
                rect.setSize(textSize);
                rect.moveTop(1);
                if (option->subControls & QStyle::SC_GroupBoxCheckBox)
                    rect.translate(indicatorWidth + 5, 0);
            }
            return visualRect(option->direction, option->rect, rect);
        }

        return rect;

    case CC_ComboBox:
        switch (subControl) {
        case SC_ComboBoxArrow: {
            const qreal dpi = QStyleHelper::dpi(option);
            rect = visualRect(option->direction, option->rect, rect);
            rect.setRect(rect.right() - int(QStyleHelper::dpiScaled(18, dpi)), rect.top() - 2,
                         int(QStyleHelper::dpiScaled(19, dpi)), rect.height() + 4);
            rect = visualRect(option->direction, option->rect, rect);
        }
            break;
        case SC_ComboBoxEditField: {
            int frameWidth = 2;
            rect = visualRect(option->direction, option->rect, rect);
            rect.setRect(option->rect.left() + frameWidth, option->rect.top() + frameWidth,
                         option->rect.width() - int(QStyleHelper::dpiScaled(19, option)) - 2 * frameWidth,
                         option->rect.height() - 2 * frameWidth);
            if (const QStyleOptionComboBox *box = qstyleoption_cast<const QStyleOptionComboBox *>(option)) {
                if (!box->editable) {
                    rect.adjust(2, 0, 0, 0);
                    if (box->state & (State_Sunken | State_On))
                        rect.translate(1, 1);
                }
            }
            rect = visualRect(option->direction, option->rect, rect);
            break;
        }
        default:
            break;
        }
        break;
    case CC_TitleBar:
        if (const QStyleOptionTitleBar *tb = qstyleoption_cast<const QStyleOptionTitleBar *>(option)) {
            SubControl sc = subControl;
            QRect &ret = rect;
            const int indent = 3;
            const int controlTopMargin = 3;
            const int controlBottomMargin = 3;
            const int controlWidthMargin = 2;
            const int controlHeight = tb->rect.height() - controlTopMargin - controlBottomMargin ;
            const int delta = controlHeight + controlWidthMargin;
            int offset = 0;

            bool isMinimized = tb->titleBarState & Qt::WindowMinimized;
            bool isMaximized = tb->titleBarState & Qt::WindowMaximized;

            switch (sc) {
            case SC_TitleBarLabel:
                if (tb->titleBarFlags & (Qt::WindowTitleHint | Qt::WindowSystemMenuHint)) {
                    ret = tb->rect;
                    if (tb->titleBarFlags & Qt::WindowSystemMenuHint)
                        ret.adjust(delta, 0, -delta, 0);
                    if (tb->titleBarFlags & Qt::WindowMinimizeButtonHint)
                        ret.adjust(0, 0, -delta, 0);
                    if (tb->titleBarFlags & Qt::WindowMaximizeButtonHint)
                        ret.adjust(0, 0, -delta, 0);
                    if (tb->titleBarFlags & Qt::WindowShadeButtonHint)
                        ret.adjust(0, 0, -delta, 0);
                    if (tb->titleBarFlags & Qt::WindowContextHelpButtonHint)
                        ret.adjust(0, 0, -delta, 0);
                }
                break;
            case SC_TitleBarContextHelpButton:
                if (tb->titleBarFlags & Qt::WindowContextHelpButtonHint)
                    offset += delta;
                Q_FALLTHROUGH();
            case SC_TitleBarMinButton:
                if (!isMinimized && (tb->titleBarFlags & Qt::WindowMinimizeButtonHint))
                    offset += delta;
                else if (sc == SC_TitleBarMinButton)
                    break;
                Q_FALLTHROUGH();
            case SC_TitleBarNormalButton:
                if (isMinimized && (tb->titleBarFlags & Qt::WindowMinimizeButtonHint))
                    offset += delta;
                else if (isMaximized && (tb->titleBarFlags & Qt::WindowMaximizeButtonHint))
                    offset += delta;
                else if (sc == SC_TitleBarNormalButton)
                    break;
                Q_FALLTHROUGH();
            case SC_TitleBarMaxButton:
                if (!isMaximized && (tb->titleBarFlags & Qt::WindowMaximizeButtonHint))
                    offset += delta;
                else if (sc == SC_TitleBarMaxButton)
                    break;
                Q_FALLTHROUGH();
            case SC_TitleBarShadeButton:
                if (!isMinimized && (tb->titleBarFlags & Qt::WindowShadeButtonHint))
                    offset += delta;
                else if (sc == SC_TitleBarShadeButton)
                    break;
                Q_FALLTHROUGH();
            case SC_TitleBarUnshadeButton:
                if (isMinimized && (tb->titleBarFlags & Qt::WindowShadeButtonHint))
                    offset += delta;
                else if (sc == SC_TitleBarUnshadeButton)
                    break;
                Q_FALLTHROUGH();
            case SC_TitleBarCloseButton:
                if (tb->titleBarFlags & Qt::WindowSystemMenuHint)
                    offset += delta;
                else if (sc == SC_TitleBarCloseButton)
                    break;
                ret.setRect(tb->rect.right() - indent - offset, tb->rect.top() + controlTopMargin,
                            controlHeight, controlHeight);
                break;
            case SC_TitleBarSysMenu:
                if (tb->titleBarFlags & Qt::WindowSystemMenuHint) {
                    ret.setRect(tb->rect.left() + controlWidthMargin + indent, tb->rect.top() + controlTopMargin,
                                controlHeight, controlHeight);
                }
                break;
            default:
                break;
            }
            ret = visualRect(tb->direction, tb->rect, ret);
        }
        break;
    default:
        break;
    }

    return rect;
}